

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall MeshLib::List<char>::append(List<char> *this,ListNode<char> *tn)

{
  ListNode<char> *pLVar1;
  List<char> *pLVar2;
  ListNode<char> *pLVar3;
  
  pLVar2 = this;
  pLVar1 = this->m_head;
  if (this->m_head != (ListNode<char> *)0x0) {
    do {
      pLVar3 = pLVar1;
      pLVar1 = pLVar3->m_next;
    } while (pLVar1 != (ListNode<char> *)0x0);
    pLVar2 = (List<char> *)&pLVar3->m_next;
  }
  pLVar2->m_head = tn;
  tn->m_next = (ListNode<char> *)0x0;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void List<T>::append( ListNode<T> * tn )
{
	if( m_head == NULL )
	{
		m_head = tn;
		m_head->next() = NULL;
		m_size ++;
		return;
	}

	ListNode<T> * n = m_head;
	while( n->next() != NULL )
	{
		n = n->next();
	}

	n->next() = tn;
	tn->next() = NULL;
	m_size ++;
}